

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall COLLADASaxFWL::KinematicAttachment::~KinematicAttachment(KinematicAttachment *this)

{
  KinematicAttachment *in_RDI;
  
  ~KinematicAttachment(in_RDI);
  operator_delete(in_RDI,0xe0);
  return;
}

Assistant:

~KinematicAttachment(){ deleteVector(mTransformations); }